

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::syslog_sink<std::mutex>::sink_it_(syslog_sink<std::mutex> *this,log_msg *msg)

{
  int iVar1;
  pointer pfVar2;
  char *pcVar3;
  size_t count;
  long in_RSI;
  long *in_RDI;
  size_t length;
  memory_buf_t formatted;
  string_view_t payload;
  allocator<char> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  size_t local_170;
  basic_string_view<char> local_168 [2];
  buffer<char> local_140 [9];
  basic_string_view<char> local_20;
  long local_10;
  
  local_10 = in_RSI;
  ::fmt::v11::basic_string_view<char>::basic_string_view(&local_20);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  basic_memory_buffer((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe68);
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_20.data_ = *(char **)(local_10 + 0x50);
    local_20.size_ = *(size_t *)(local_10 + 0x58);
  }
  else {
    pfVar2 = CLI::std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::
             operator->((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                        0x6a470d);
    (*pfVar2->_vptr_formatter[2])(pfVar2,local_10,local_140);
    pcVar3 = ::fmt::v11::detail::buffer<char>::data(local_140);
    count = ::fmt::v11::detail::buffer<char>::size(local_140);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_168,pcVar3,count);
    local_20.data_ = local_168[0].data_;
    local_20.size_ = local_168[0].size_;
  }
  local_170 = ::fmt::v11::basic_string_view<char>::size(&local_20);
  iVar1 = std::numeric_limits<int>::max();
  if ((ulong)(long)iVar1 < local_170) {
    iVar1 = std::numeric_limits<int>::max();
    local_170 = (size_t)iVar1;
  }
  iVar1 = (**(code **)(*in_RDI + 0x50))(in_RDI,local_10);
  pcVar3 = ::fmt::v11::basic_string_view<char>::data(&local_20);
  syslog(iVar1,"%.*s",(ulong)(uint)local_170,pcVar3);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x6a483e);
  return;
}

Assistant:

void sink_it_(const details::log_msg &msg) override {
        string_view_t payload;
        memory_buf_t formatted;
        if (enable_formatting_) {
            base_sink<Mutex>::formatter_->format(msg, formatted);
            payload = string_view_t(formatted.data(), formatted.size());
        } else {
            payload = msg.payload;
        }

        size_t length = payload.size();
        // limit to max int
        if (length > static_cast<size_t>(std::numeric_limits<int>::max())) {
            length = static_cast<size_t>(std::numeric_limits<int>::max());
        }

        ::syslog(syslog_prio_from_level(msg), "%.*s", static_cast<int>(length), payload.data());
    }